

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O3

int ptm_mgau_frame_eval(ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,
                       int32 n_senone_active,mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  void *__s;
  mfcc_t *pmVar9;
  float *pfVar10;
  int *piVar11;
  float *pfVar12;
  bool bVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char **ppcVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  short sVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  size_t __n;
  byte *pbVar27;
  long lVar28;
  long lVar29;
  float *pfVar30;
  int iVar31;
  char **ppcVar32;
  float *pfVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  float *pfVar37;
  long *plVar38;
  ulong uVar39;
  long lVar40;
  mfcc_t *pmVar41;
  int *piVar42;
  long lVar43;
  float *pfVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  iVar31 = *(int *)&ps[6].vt;
  iVar24 = frame % iVar31;
  ppcVar32 = &(ps[5].vt)->name + (long)iVar24 * 2;
  *(char ***)&ps[5].frame_idx = ppcVar32;
  if (ps->frame_idx <= frame) {
    ppcVar18 = &(ps[5].vt)->name + (long)iVar31 * 2;
    if (iVar24 != 0) {
      ppcVar18 = ppcVar32;
    }
    memcpy((void *)**(undefined8 **)*ppcVar32,(void *)**(undefined8 **)ppcVar18[-2],
           (long)(short)ps[4].frame_idx *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24) *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x20) * 8);
    iVar24 = *(int *)(*(long *)&ps[1].frame_idx + 0x20);
    iVar31 = iVar24 + 0x1f;
    iVar24 = iVar24 + 0x3e;
    if (-1 < iVar31) {
      iVar24 = iVar31;
    }
    __n = (long)(iVar24 >> 5) << 2;
    __s = *(void **)(*(long *)&ps[5].frame_idx + 8);
    if (compallsen == 0) {
      uVar39 = 0;
      memset(__s,0,__n);
      if (0 < n_senone_active) {
        lVar19 = *(long *)&ps[2].frame_idx;
        lVar20 = *(long *)(*(long *)&ps[5].frame_idx + 8);
        uVar36 = 0;
        do {
          uVar39 = (uVar39 & 0xffffffff) + (ulong)senone_active[uVar36];
          bVar6 = *(byte *)(lVar19 + uVar39);
          puVar1 = (uint *)(lVar20 + (ulong)(bVar6 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << (bVar6 & 0x1f);
          uVar36 = uVar36 + 1;
        } while ((uint)n_senone_active != uVar36);
      }
    }
    else {
      memset(__s,0xff,__n);
    }
    plVar38 = *(long **)&ps[1].frame_idx;
    if (0 < (int)plVar38[4]) {
      lVar19 = 0;
      do {
        if (0 < *(int *)((long)plVar38 + 0x24)) {
          sVar23 = (short)ps[4].frame_idx;
          lVar20 = 0;
          do {
            if (0 < sVar23) {
              pmVar9 = featbuf[lVar20];
              lVar21 = *(long *)(*(long *)(**(long **)&ps[5].frame_idx + lVar19 * 8) + lVar20 * 8);
              iVar31 = *(int *)(plVar38[6] + lVar20 * 4);
              iVar34 = iVar31 % 4;
              iVar24 = 0;
              if (0 < iVar34) {
                iVar24 = iVar34;
              }
              uVar39 = 0;
              do {
                iVar26 = *(int *)(lVar21 + uVar39 * 8);
                plVar38 = *(long **)&ps[1].frame_idx;
                fVar45 = *(float *)(*(long *)(*(long *)(plVar38[2] + lVar19 * 8) + lVar20 * 8) +
                                   (long)iVar26 * 4);
                lVar28 = (long)(iVar26 * iVar31) * 4;
                lVar43 = **(long **)(*(long *)(*plVar38 + lVar19 * 8) + lVar20 * 8) + lVar28;
                lVar28 = lVar28 + **(long **)(*(long *)(plVar38[1] + lVar19 * 8) + lVar20 * 8);
                if (iVar34 < 1) {
                  iVar26 = 0;
                  pmVar41 = pmVar9;
                }
                else {
                  lVar29 = 0;
                  lVar40 = 0;
                  do {
                    fVar46 = (float)pmVar9[lVar40] - *(float *)(lVar43 + lVar40 * 4);
                    fVar45 = fVar45 - fVar46 * fVar46 * *(float *)(lVar28 + lVar40 * 4);
                    lVar40 = lVar40 + 1;
                    lVar29 = lVar29 + -4;
                  } while (iVar34 != (int)lVar40);
                  lVar28 = lVar28 - lVar29;
                  lVar43 = lVar43 - lVar29;
                  pmVar41 = (mfcc_t *)((long)pmVar9 - lVar29);
                  iVar26 = iVar34;
                }
                if (iVar26 < iVar31) {
                  lVar29 = 0;
                  do {
                    uVar4 = *(undefined8 *)(lVar43 + lVar29 * 4);
                    fVar46 = (float)*(undefined8 *)(pmVar41 + lVar29) - (float)uVar4;
                    fVar47 = (float)((ulong)*(undefined8 *)(pmVar41 + lVar29) >> 0x20) -
                             (float)((ulong)uVar4 >> 0x20);
                    uVar4 = *(undefined8 *)(lVar43 + 8 + lVar29 * 4);
                    fVar48 = (float)*(undefined8 *)(pmVar41 + lVar29 + 2) - (float)uVar4;
                    fVar49 = (float)((ulong)*(undefined8 *)(pmVar41 + lVar29 + 2) >> 0x20) -
                             (float)((ulong)uVar4 >> 0x20);
                    uVar4 = *(undefined8 *)(lVar28 + lVar29 * 4);
                    uVar5 = *(undefined8 *)(lVar28 + 8 + lVar29 * 4);
                    fVar45 = (((fVar45 - (float)uVar4 * fVar46 * fVar46) -
                              (float)((ulong)uVar4 >> 0x20) * fVar47 * fVar47) -
                             fVar48 * fVar48 * (float)uVar5) -
                             fVar49 * fVar49 * (float)((ulong)uVar5 >> 0x20);
                    lVar29 = lVar29 + 4;
                  } while (iVar24 + (int)lVar29 < iVar31);
                }
                if (-2.1474836e+09 <= fVar45) {
                  *(int *)(lVar21 + 4 + uVar39 * 8) = (int)fVar45;
                  if (uVar39 != 0) {
                    uVar4 = *(undefined8 *)(lVar21 + uVar39 * 8);
                    uVar36 = uVar39;
                    do {
                      if ((int)fVar45 <= *(int *)(lVar21 + -4 + uVar36 * 8)) goto LAB_00140e2b;
                      *(undefined8 *)(lVar21 + uVar36 * 8) =
                           *(undefined8 *)(lVar21 + -8 + uVar36 * 8);
                      bVar13 = 1 < uVar36;
                      uVar36 = uVar36 - 1;
                    } while (bVar13);
                    uVar36 = 0;
LAB_00140e2b:
                    *(undefined8 *)(lVar21 + (long)(int)uVar36 * 8) = uVar4;
                    sVar23 = (short)ps[4].frame_idx;
                  }
                }
                else {
                  *(undefined4 *)(lVar21 + 4 + uVar39 * 8) = 0x80000000;
                }
                uVar39 = uVar39 + 1;
              } while ((long)uVar39 < (long)sVar23);
              plVar38 = *(long **)&ps[1].frame_idx;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < *(int *)((long)plVar38 + 0x24));
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (int)plVar38[4]);
      if ((0 < (int)plVar38[4]) && (frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0)) {
        uVar39 = 0;
        do {
          if (((*(uint *)(*(long *)(*(long *)&ps[5].frame_idx + 8) + (uVar39 >> 5 & 0x7ffffff) * 4)
                >> ((uint)uVar39 & 0x1f) & 1) != 0) && (0 < *(int *)((long)plVar38 + 0x24))) {
            lVar19 = 0;
            do {
              lVar20 = plVar38[5];
              if (0 < (long)(int)lVar20) {
                pfVar10 = (float *)featbuf[lVar19];
                piVar11 = *(int **)(*(long *)(**(long **)&ps[5].frame_idx + uVar39 * 8) + lVar19 * 8
                                   );
                lVar21 = (long)(short)ps[4].frame_idx;
                piVar3 = piVar11 + lVar21 * 2 + -2;
                pfVar12 = *(float **)(*(long *)(plVar38[2] + uVar39 * 8) + lVar19 * 8);
                iVar31 = *(int *)(plVar38[6] + lVar19 * 4);
                pfVar30 = (float *)**(long **)(*(long *)(plVar38[1] + uVar39 * 8) + lVar19 * 8);
                pfVar44 = (float *)**(long **)(*(long *)(*plVar38 + uVar39 * 8) + lVar19 * 8);
                pfVar37 = pfVar12;
                do {
                  iVar24 = 0;
                  fVar45 = *pfVar37;
                  fVar46 = (float)piVar11[lVar21 * 2 + -1];
                  pfVar33 = pfVar10;
                  if ((0 < iVar31 % 4) && (fVar46 <= fVar45)) {
                    iVar24 = 0;
                    do {
                      fVar47 = *pfVar33;
                      pfVar33 = pfVar33 + 1;
                      fVar48 = *pfVar44;
                      pfVar44 = pfVar44 + 1;
                      fVar49 = *pfVar30;
                      pfVar30 = pfVar30 + 1;
                      fVar45 = fVar45 - (fVar47 - fVar48) * (fVar47 - fVar48) * fVar49;
                      iVar24 = iVar24 + 1;
                      if (iVar31 % 4 <= iVar24) break;
                    } while (fVar46 <= fVar45);
                  }
                  bVar13 = iVar24 < iVar31;
                  if (iVar24 < iVar31) {
                    while (fVar46 <= fVar45) {
                      fVar47 = (float)*(undefined8 *)pfVar33 - (float)*(undefined8 *)pfVar44;
                      fVar48 = (float)((ulong)*(undefined8 *)pfVar33 >> 0x20) -
                               (float)((ulong)*(undefined8 *)pfVar44 >> 0x20);
                      fVar49 = (float)*(undefined8 *)(pfVar33 + 2) -
                               (float)*(undefined8 *)(pfVar44 + 2);
                      fVar50 = (float)((ulong)*(undefined8 *)(pfVar33 + 2) >> 0x20) -
                               (float)((ulong)*(undefined8 *)(pfVar44 + 2) >> 0x20);
                      fVar45 = (((fVar45 - (float)*(undefined8 *)pfVar30 * fVar47 * fVar47) -
                                (float)((ulong)*(undefined8 *)pfVar30 >> 0x20) * fVar48 * fVar48) -
                               fVar49 * fVar49 * (float)*(undefined8 *)(pfVar30 + 2)) -
                               fVar50 * fVar50 *
                               (float)((ulong)*(undefined8 *)(pfVar30 + 2) >> 0x20);
                      pfVar30 = pfVar30 + 4;
                      pfVar44 = pfVar44 + 4;
                      iVar24 = iVar24 + 4;
                      bVar13 = iVar24 < iVar31;
                      if (iVar31 <= iVar24) break;
                      pfVar33 = pfVar33 + 4;
                    }
                  }
                  if (bVar13) {
                    pfVar44 = pfVar44 + (iVar31 - iVar24);
                    pfVar30 = pfVar30 + (iVar31 - iVar24);
                  }
                  else if (fVar46 <= fVar45) {
                    lVar28 = (long)(short)ps[4].frame_idx;
                    iVar24 = (int)((ulong)((long)pfVar37 - (long)pfVar12) >> 2);
                    if (0 < lVar28) {
                      lVar43 = 0;
                      do {
                        if (piVar11[lVar43 * 2] == iVar24) goto LAB_001410ed;
                        lVar43 = lVar43 + 1;
                      } while (lVar28 != lVar43);
                    }
                    if (-2.1474836e+09 <= fVar45) {
                      piVar42 = piVar11 + lVar21 * 2 + -4;
                      for (piVar2 = piVar3; (piVar11 <= piVar42 && (piVar2[-1] <= (int)fVar45));
                          piVar2 = piVar2 + -2) {
                        *(undefined8 *)piVar2 = *(undefined8 *)(piVar2 + -2);
                        piVar42 = piVar2 + -4;
                      }
                      *piVar2 = iVar24;
                      piVar2[1] = (int)fVar45;
                    }
                    else {
                      *piVar3 = iVar24;
                      piVar3[1] = -0x80000000;
                    }
                  }
LAB_001410ed:
                  pfVar37 = pfVar37 + 1;
                } while (pfVar37 < pfVar12 + (int)lVar20);
                plVar38 = *(long **)&ps[1].frame_idx;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < *(int *)((long)plVar38 + 0x24));
          }
          uVar39 = uVar39 + 1;
        } while ((long)uVar39 < (long)(int)plVar38[4]);
      }
    }
    if (0 < *(int *)((long)plVar38 + 0x24)) {
      lVar19 = 0;
      do {
        uVar39 = (ulong)(int)plVar38[4];
        if (0 < (long)uVar39) {
          iVar31 = -0x20000000;
          uVar36 = 0;
          do {
            if (((*(uint *)((*(long **)&ps[5].frame_idx)[1] + (uVar36 >> 5 & 0x7ffffff) * 4) >>
                  ((uint)uVar36 & 0x1f) & 1) != 0) &&
               (iVar24 = *(int *)(*(long *)(*(long *)(**(long **)&ps[5].frame_idx + uVar36 * 8) +
                                           lVar19 * 8) + 4) >> 10, iVar31 <= iVar24)) {
              iVar31 = iVar24;
            }
            uVar36 = uVar36 + 1;
          } while (uVar39 != uVar36);
          uVar36 = 0;
          do {
            plVar38 = *(long **)&ps[5].frame_idx;
            if (((*(uint *)(plVar38[1] + (uVar36 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar36 & 0x1f) & 1
                 ) != 0) && (0 < (short)ps[4].frame_idx)) {
              lVar20 = 0;
              do {
                lVar21 = *(long *)(*(long *)(*plVar38 + uVar36 * 8) + lVar19 * 8);
                iVar24 = iVar31 - (*(int *)(lVar21 + 4 + lVar20 * 8) >> 10);
                if (0x5f < iVar24) {
                  iVar24 = 0x60;
                }
                *(int *)(lVar21 + 4 + lVar20 * 8) = iVar24;
                lVar20 = lVar20 + 1;
              } while (lVar20 < (short)ps[4].frame_idx);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar39);
          plVar38 = *(long **)&ps[1].frame_idx;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < *(int *)((long)plVar38 + 0x24));
    }
  }
  memset(senone_scores,0,(long)*(int *)&ps[2].vt * 2);
  auVar17 = _DAT_00155b70;
  auVar16 = _DAT_00154950;
  auVar15 = _DAT_00154940;
  if (compallsen != 0) {
    n_senone_active = *(int32 *)&ps[2].vt;
  }
  if (n_senone_active < 1) {
    iVar31 = 0xffff;
  }
  else {
    lVar19 = *(long *)&ps[2].frame_idx;
    plVar38 = *(long **)&ps[5].frame_idx;
    lVar20 = plVar38[1];
    uVar8 = *(uint *)(*(long *)&ps[1].frame_idx + 0x24);
    iVar31 = 0x7fffffff;
    uVar39 = 0;
    iVar24 = 0;
    do {
      iVar34 = (int)uVar39;
      if (compallsen == 0) {
        iVar34 = iVar24 + (uint)senone_active[uVar39];
      }
      lVar21 = (long)iVar34;
      bVar6 = *(byte *)(lVar19 + lVar21);
      if ((*(uint *)(lVar20 + (ulong)(bVar6 >> 5) * 4) >> (bVar6 & 0x1f) & 1) == 0) {
        if (0 < (int)uVar8) {
          sVar23 = (short)ps[4].frame_idx;
          lVar28 = (long)(int)sVar23 + -1;
          auVar51._8_4_ = (int)lVar28;
          auVar51._0_8_ = lVar28;
          auVar51._12_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar51 = auVar51 ^ auVar16;
          uVar36 = 0;
          do {
            if (0 < sVar23) {
              lVar28 = *(long *)(*(long *)(*plVar38 + (ulong)bVar6 * 8) + uVar36 * 8);
              uVar22 = 0;
              auVar52 = auVar15;
              auVar53 = auVar17;
              do {
                auVar54 = auVar52 ^ auVar16;
                iVar24 = auVar51._4_4_;
                if ((bool)(~(auVar54._4_4_ == iVar24 && auVar51._0_4_ < auVar54._0_4_ ||
                            iVar24 < auVar54._4_4_) & 1)) {
                  *(undefined4 *)(lVar28 + 4 + uVar22) = 0x60;
                }
                if ((auVar54._12_4_ != auVar51._12_4_ || auVar54._8_4_ <= auVar51._8_4_) &&
                    auVar54._12_4_ <= auVar51._12_4_) {
                  *(undefined4 *)(lVar28 + 0xc + uVar22) = 0x60;
                }
                iVar26 = SUB164(auVar53 ^ auVar16,4);
                if (iVar26 <= iVar24 &&
                    (iVar26 != iVar24 || SUB164(auVar53 ^ auVar16,0) <= auVar51._0_4_)) {
                  *(undefined4 *)(lVar28 + 0x14 + uVar22) = 0x60;
                  *(undefined4 *)(lVar28 + 0x1c + uVar22) = 0x60;
                }
                lVar43 = auVar52._8_8_;
                auVar52._0_8_ = auVar52._0_8_ + 4;
                auVar52._8_8_ = lVar43 + 4;
                lVar43 = auVar53._8_8_;
                auVar53._0_8_ = auVar53._0_8_ + 4;
                auVar53._8_8_ = lVar43 + 4;
                uVar22 = uVar22 + 0x20;
              } while ((sVar23 * 8 + 0x18U & 0x7ffe0) != uVar22);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar8);
          goto LAB_0014140f;
        }
LAB_001414d1:
        iVar24 = 0;
      }
      else {
LAB_0014140f:
        if ((int)uVar8 < 1) goto LAB_001414d1;
        sVar23 = (short)ps[4].frame_idx;
        uVar36 = 0;
        iVar24 = 0;
        do {
          iVar26 = 0;
          if (0 < sVar23) {
            lVar28 = *(long *)(*(long *)(*plVar38 + (ulong)bVar6 * 8) + uVar36 * 8);
            lVar43 = 0;
            iVar26 = 0;
            do {
              lVar29 = *(long *)((&(ps[3].vt)->name)[uVar36] +
                                (long)*(int *)(lVar28 + lVar43 * 8) * 8);
              if (ps[4].vt == (ps_mgaufuncs_t *)0x0) {
                pbVar27 = (byte *)(lVar29 + lVar21);
              }
              else {
                bVar7 = *(byte *)(lVar29 + iVar34 / 2);
                uVar35 = bVar7 & 0xf;
                if ((bVar7 & 1) != 0) {
                  uVar35 = (uint)(bVar7 >> 4);
                }
                pbVar27 = (byte *)((long)&(ps[4].vt)->name + (ulong)uVar35);
              }
              if (lVar43 == 0) {
                iVar26 = (uint)*pbVar27 + *(int *)(lVar28 + 4);
              }
              else {
                iVar25 = (uint)*pbVar27 + *(int *)(lVar28 + 4 + lVar43 * 8);
                uVar35 = iVar26 - iVar25;
                if (iVar26 < iVar25) {
                  iVar25 = iVar26;
                }
                uVar14 = -uVar35;
                if (0 < (int)uVar35) {
                  uVar14 = uVar35;
                }
                iVar26 = iVar25 - (uint)*(byte *)(**(long **)&ps[6].frame_idx + (ulong)uVar14);
              }
              lVar43 = lVar43 + 1;
            } while (sVar23 != lVar43);
          }
          iVar24 = iVar24 + iVar26;
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar8);
      }
      if (iVar24 < iVar31) {
        iVar31 = iVar24;
      }
      senone_scores[lVar21] = (int16)iVar24;
      uVar39 = uVar39 + 1;
      iVar24 = iVar34;
    } while (uVar39 != (uint)n_senone_active);
  }
  iVar24 = *(int *)&ps[2].vt;
  if (0 < (long)iVar24) {
    lVar19 = 0;
    do {
      senone_scores[lVar19] = senone_scores[lVar19] - (short)iVar31;
      lVar19 = lVar19 + 1;
    } while (iVar24 != lVar19);
  }
  return 0;
}

Assistant:

int32
ptm_mgau_frame_eval(ps_mgau_t *ps,
                    int16 *senone_scores,
                    uint8 *senone_active,
                    int32 n_senone_active,
                    mfcc_t ** featbuf, int32 frame,
                    int32 compallsen)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int fast_eval_idx;

    /* Find the appropriate frame in the rotating history buffer
     * corresponding to the requested input frame.  No bounds checking
     * is done here, which just means you'll get semi-random crap if
     * you request a frame in the future or one that's too far in the
     * past.  Since the history buffer is just used for fast match
     * that might not be fatal. */
    fast_eval_idx = frame % s->n_fast_hist;
    s->f = s->hist + fast_eval_idx;
    /* Compute the top-N codewords for every codebook, unless this
     * is a past frame, in which case we already have them (we
     * hope!) */
    if (frame >= ps_mgau_base(ps)->frame_idx) {
        ptm_fast_eval_t *lastf;
        /* Get the previous frame's top-N information (on the
         * first frame of the input this is just all WORST_DIST,
         * no harm in that) */
        if (fast_eval_idx == 0)
            lastf = s->hist + s->n_fast_hist - 1;
        else
            lastf = s->hist + fast_eval_idx - 1;
        /* Copy in initial top-N info */
        memcpy(s->f->topn[0][0], lastf->topn[0][0],
               s->g->n_mgau * s->g->n_feat * s->max_topn * sizeof(ptm_topn_t));
        /* Generate initial active codebook list (this might not be
         * necessary) */
        ptm_mgau_calc_cb_active(s, senone_active, n_senone_active, compallsen);
        /* Now evaluate top-N, prune, and evaluate remaining codebooks. */
        ptm_mgau_codebook_eval(s, featbuf, frame);
        ptm_mgau_codebook_norm(s, featbuf, frame);
    }
    /* Evaluate intersection of active senones and active codebooks. */
    ptm_mgau_senone_eval(s, senone_scores, senone_active,
                         n_senone_active, compallsen);

    return 0;
}